

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_ems_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  SSL *ssl;
  ssl_session_st *psVar1;
  uint16_t uVar2;
  bool bVar3;
  
  ssl = hs->ssl;
  if (contents != (CBS *)0x0) {
    uVar2 = ssl_protocol_version(ssl);
    if ((0x303 < uVar2) || (contents->len != 0)) {
      return false;
    }
    hs->field_0x6ca = hs->field_0x6ca | 2;
  }
  psVar1 = (ssl->s3->established_session)._M_t.
           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
  bVar3 = true;
  if ((psVar1 != (ssl_session_st *)0x0) &&
     ((*(uint *)&hs->field_0x6c8 >> 0x11 & 1) != ((byte)psVar1->field_0x1b8 & 1))) {
    bVar3 = false;
    ERR_put_error(0x10,0,0x107,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x366);
    *out_alert = '/';
  }
  return bVar3;
}

Assistant:

static bool ext_ems_parse_serverhello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                      CBS *contents) {
  SSL *const ssl = hs->ssl;

  if (contents != NULL) {
    if (ssl_protocol_version(ssl) >= TLS1_3_VERSION ||  //
        CBS_len(contents) != 0) {
      return false;
    }

    hs->extended_master_secret = true;
  }

  // Whether EMS is negotiated may not change on renegotiation.
  if (ssl->s3->established_session != nullptr &&
      hs->extended_master_secret !=
          !!ssl->s3->established_session->extended_master_secret) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RENEGOTIATION_EMS_MISMATCH);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  return true;
}